

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.h
# Opt level: O1

char * __thiscall Memory::JitArenaAllocator::Alloc(JitArenaAllocator *this,size_t requestedBytes)

{
  BVSparseNode *pBVar1;
  BVSparseNode *node;
  char *pcVar2;
  
  if (requestedBytes != 0x18) {
    pcVar2 = ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                       ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this,
                        requestedBytes);
    return pcVar2;
  }
  pBVar1 = this->bvFreeList;
  if (pBVar1 != (BVSparseNode *)0x0) {
    this->bvFreeList = pBVar1->next;
    return (char *)pBVar1;
  }
  pcVar2 = ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::RealAllocInlined
                     ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this,
                      0x18);
  return pcVar2;
}

Assistant:

char * Alloc(DECLSPEC_GUARD_OVERFLOW size_t requestedBytes)
    {
        // Fast path
        if (sizeof(BVSparseNode) == requestedBytes)
        {
            // Fast path for BVSparseNode allocation
            if (bvFreeList)
            {
                BVSparseNode *node = bvFreeList;
                bvFreeList = bvFreeList->next;
                return (char*)node;
            }

            // If the free list is empty, then do the allocation right away for the BVSparseNode size.
            // You could call ArenaAllocator::Alloc here, but direct RealAlloc avoids unnecessary checks.
            return ArenaAllocatorBase::RealAllocInlined(requestedBytes);
        }
        return ArenaAllocator::Alloc(requestedBytes);

    }